

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *sib,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
          Filtration_value *filt)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  pointer ppVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar6;
  undefined1 local_98 [40];
  Simplex_tree<Gudhi::Simplex_tree_options_default> *local_70;
  __node_base_ptr local_68;
  undefined1 local_60 [8];
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  insertion_result;
  Vertex_handle vertex_one;
  Filtration_value *filt_local;
  Siblings *sib_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  *res;
  undefined8 uVar5;
  
  this_local = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)filt;
  last_local = last;
  puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&last_local);
  uVar1 = *puVar3;
  __lhs = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&last_local);
  bVar2 = __gnu_cxx::operator==
                    (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &this_local);
  if (bVar2) {
    insert_node_<true,false,true,double_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&insertion_result.second,sib,
               (Vertex_handle)first._M_current,(double *)(ulong)uVar1);
    std::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
                *)this,(pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
                        *)&insertion_result.second);
    uVar5 = extraout_RDX;
  }
  else {
    insert_node_<true,true,false,double_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_60,sib,
               (Vertex_handle)first._M_current,(double *)(ulong)uVar1);
    ppVar4 = boost::container::
             vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
             ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                           *)local_60);
    first_00._M_current =
         (int *)Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                ::children(&ppVar4->second);
    local_68 = (__node_base_ptr)last_local._M_current;
    local_70 = this_local;
    rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this,sib,first_00,last_local,(Filtration_value *)this_local);
    null_simplex();
    bVar2 = boost::container::operator!=
                      ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)this,(vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                                *)(local_98 + 0x20));
    uVar5 = extraout_RDX_00;
    if (bVar2) {
      local_98._24_8_ = last_local._M_current;
      local_98._16_8_ = this_local;
      pVar6 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_98,sib,first,
                         last_local,(Filtration_value *)this_local);
      uVar5 = pVar6._8_8_;
    }
  }
  pVar6._8_8_ = uVar5;
  pVar6.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar6;
}

Assistant:

std::pair<Simplex_handle, bool> rec_insert_simplex_and_subfaces_sorted(Siblings* sib,
                                                                         ForwardVertexIterator first,
                                                                         ForwardVertexIterator last,
                                                                         const Filtration_value& filt)
  {
    // An alternative strategy would be:
    // - try to find the complete simplex, if found (and low filtration) exit
    // - insert all the vertices at once in sib
    // - loop over those (new or not) simplices, with a recursive call(++first, last)
    Vertex_handle vertex_one = *first;

    if (++first == last) return insert_node_<true, false, true>(sib, vertex_one, filt);

    // TODO: have special code here, we know we are building the whole subtree from scratch.
    auto insertion_result = insert_node_<true, true, false>(sib, vertex_one, filt);

    auto res = rec_insert_simplex_and_subfaces_sorted(insertion_result.first->second.children(), first, last, filt);
    // No need to continue if the full simplex was already there with a low enough filtration value.
    if (res.first != null_simplex()) rec_insert_simplex_and_subfaces_sorted(sib, first, last, filt);
    return res;
  }